

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_yang.c
# Opt level: O0

int yang_check_anydata(lys_module *module,lys_node_anydata *anydata,lys_node **child,int options,
                      unres_schema *unres)

{
  int iVar1;
  unres_schema *unres_local;
  int options_local;
  lys_node **child_local;
  lys_node_anydata *anydata_local;
  lys_module *module_local;
  
  iVar1 = yang_check_iffeatures(module,(void *)0x0,anydata,ANYDATA_KEYWORD,unres);
  if (iVar1 == 0) {
    iVar1 = yang_check_nodes(module,(lys_node *)anydata,*child,options,unres);
    if (iVar1 == 0) {
      *child = (lys_node *)0x0;
      if (((anydata->when == (lys_when *)0x0) ||
          (iVar1 = yang_check_ext_instance
                             (module,&anydata->when->ext,(uint)anydata->when->ext_size,anydata->when
                              ,unres), iVar1 == 0)) &&
         (iVar1 = yang_check_must(module,anydata->must,(uint)anydata->must_size,unres), iVar1 == 0))
      {
        if ((((module->ctx->models).flags & 2U) != 0) ||
           ((anydata->when == (lys_when *)0x0 && (anydata->must_size == '\0')))) {
          return 0;
        }
        if ((options & 4U) == 0) {
          iVar1 = unres_schema_add_node(module,unres,anydata,UNRES_XPATH,(lys_node *)0x0);
          if (iVar1 != -1) {
            return 0;
          }
        }
        else {
          iVar1 = lyxp_node_check_syntax((lys_node *)anydata);
          if (iVar1 == 0) {
            return 0;
          }
        }
      }
    }
    else {
      *child = (lys_node *)0x0;
    }
  }
  return 1;
}

Assistant:

static int
yang_check_anydata(struct lys_module *module, struct lys_node_anydata *anydata, struct lys_node **child,
                   int options, struct unres_schema *unres)
{
    if (yang_check_iffeatures(module, NULL, anydata, ANYDATA_KEYWORD, unres)) {
        goto error;
    }

    if (yang_check_nodes(module, (struct lys_node *)anydata, *child, options, unres)) {
        *child = NULL;
        goto error;
    }
    *child = NULL;

    if (anydata->when && yang_check_ext_instance(module, &anydata->when->ext, anydata->when->ext_size, anydata->when, unres)) {
        goto error;
    }
    if (yang_check_must(module, anydata->must, anydata->must_size, unres)) {
        goto error;
    }

    /* check XPath dependencies */
    if (!(module->ctx->models.flags & LY_CTX_TRUSTED) && (anydata->when || anydata->must_size)) {
        if (options & LYS_PARSE_OPT_INGRP) {
            if (lyxp_node_check_syntax((struct lys_node *)anydata)) {
                goto error;
            }
        } else {
            if (unres_schema_add_node(module, unres, anydata, UNRES_XPATH, NULL) == -1) {
                goto error;
            }
        }
    }

    return EXIT_SUCCESS;

error:
    return EXIT_FAILURE;
}